

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

fdb_status wal_shutdown(filemgr *file,err_log_callback *log_callback)

{
  fdb_status fVar1;
  
  fVar1 = _wal_close(file,WAL_DISCARD_ALL,(void *)0x0,log_callback);
  LOCK();
  (file->wal->size).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (file->wal->num_flushable).super___atomic_base<unsigned_int>._M_i = 0;
  UNLOCK();
  LOCK();
  (file->wal->datasize).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (file->wal->mem_overhead).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  LOCK();
  (file->wal->isPopulated).super___atomic_base<unsigned_char>._M_i = '\0';
  UNLOCK();
  return fVar1;
}

Assistant:

fdb_status wal_shutdown(struct filemgr *file, err_log_callback *log_callback)
{
    fdb_status wr = _wal_close(file, WAL_DISCARD_ALL, NULL, log_callback);
    atomic_store_uint32_t(&file->wal->size, 0);
    atomic_store_uint32_t(&file->wal->num_flushable, 0);
    atomic_store_uint64_t(&file->wal->datasize, 0);
    atomic_store_uint64_t(&file->wal->mem_overhead, 0);
    atomic_store_uint8_t(&file->wal->isPopulated, 0);
    return wr;
}